

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpack_parser.hpp
# Opt level: O0

void __thiscall
jsoncons::msgpack::
basic_msgpack_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::parse
          (basic_msgpack_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *this
          ,item_event_visitor *visitor,error_code *ec)

{
  bool bVar1;
  reference pvVar2;
  size_type sVar3;
  string *s;
  error_code *in_RDX;
  long in_RDI;
  error_code *in_stack_00000230;
  item_event_visitor *in_stack_00000238;
  basic_msgpack_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>
  *in_stack_00000240;
  error_code *in_stack_ffffffffffffff80;
  assertion_error *this_00;
  item_event_visitor *in_stack_ffffffffffffff88;
  basic_msgpack_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>
  *in_stack_ffffffffffffff90;
  byte local_59;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 uVar4;
  undefined4 in_stack_ffffffffffffffb4;
  char *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  
  while( true ) {
    local_59 = 0;
    if ((*(byte *)(in_RDI + 9) & 1) == 0) {
      local_59 = *(byte *)(in_RDI + 8);
    }
    if ((local_59 & 1) == 0) break;
    pvVar2 = std::
             vector<jsoncons::msgpack::parse_state,_std::allocator<jsoncons::msgpack::parse_state>_>
             ::back((vector<jsoncons::msgpack::parse_state,_std::allocator<jsoncons::msgpack::parse_state>_>
                     *)in_stack_ffffffffffffff80);
    switch(pvVar2->mode) {
    case root:
      pvVar2 = std::
               vector<jsoncons::msgpack::parse_state,_std::allocator<jsoncons::msgpack::parse_state>_>
               ::back((vector<jsoncons::msgpack::parse_state,_std::allocator<jsoncons::msgpack::parse_state>_>
                       *)in_stack_ffffffffffffff80);
      pvVar2->mode = accept;
      read_item(in_stack_00000240,in_stack_00000238,in_stack_00000230);
      bVar1 = std::error_code::operator_cast_to_bool(in_RDX);
      if (bVar1) {
        return;
      }
      break;
    case accept:
      sVar3 = std::
              vector<jsoncons::msgpack::parse_state,_std::allocator<jsoncons::msgpack::parse_state>_>
              ::size((vector<jsoncons::msgpack::parse_state,_std::allocator<jsoncons::msgpack::parse_state>_>
                      *)(in_RDI + 0x200));
      if (sVar3 != 1) {
        uVar4 = CONCAT13(1,(int3)in_stack_ffffffffffffffb0);
        s = (string *)__cxa_allocate_exception(0x10);
        this_00 = (assertion_error *)&stack0xffffffffffffffc7;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                   (allocator<char> *)CONCAT44(in_stack_ffffffffffffffb4,uVar4));
        assertion_error::assertion_error(this_00,s);
        __cxa_throw(s,&assertion_error::typeinfo,assertion_error::~assertion_error);
      }
      std::vector<jsoncons::msgpack::parse_state,_std::allocator<jsoncons::msgpack::parse_state>_>::
      clear((vector<jsoncons::msgpack::parse_state,_std::allocator<jsoncons::msgpack::parse_state>_>
             *)0x1aea17);
      *(undefined1 *)(in_RDI + 8) = 0;
      *(undefined1 *)(in_RDI + 9) = 1;
      basic_item_event_visitor<char>::flush((basic_item_event_visitor<char> *)0x1aea2e);
      break;
    case array:
      pvVar2 = std::
               vector<jsoncons::msgpack::parse_state,_std::allocator<jsoncons::msgpack::parse_state>_>
               ::back((vector<jsoncons::msgpack::parse_state,_std::allocator<jsoncons::msgpack::parse_state>_>
                       *)in_stack_ffffffffffffff80);
      in_stack_ffffffffffffff90 =
           (basic_msgpack_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *)
           pvVar2->index;
      pvVar2 = std::
               vector<jsoncons::msgpack::parse_state,_std::allocator<jsoncons::msgpack::parse_state>_>
               ::back((vector<jsoncons::msgpack::parse_state,_std::allocator<jsoncons::msgpack::parse_state>_>
                       *)in_stack_ffffffffffffff80);
      if (in_stack_ffffffffffffff90 <
          (basic_msgpack_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *)
          pvVar2->length) {
        pvVar2 = std::
                 vector<jsoncons::msgpack::parse_state,_std::allocator<jsoncons::msgpack::parse_state>_>
                 ::back((vector<jsoncons::msgpack::parse_state,_std::allocator<jsoncons::msgpack::parse_state>_>
                         *)in_stack_ffffffffffffff80);
        pvVar2->index = pvVar2->index + 1;
        read_item(in_stack_00000240,in_stack_00000238,in_stack_00000230);
        bVar1 = std::error_code::operator_cast_to_bool(in_RDX);
        if (bVar1) {
          return;
        }
      }
      else {
        end_array(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
      }
      break;
    case map_key:
      pvVar2 = std::
               vector<jsoncons::msgpack::parse_state,_std::allocator<jsoncons::msgpack::parse_state>_>
               ::back((vector<jsoncons::msgpack::parse_state,_std::allocator<jsoncons::msgpack::parse_state>_>
                       *)in_stack_ffffffffffffff80);
      in_stack_ffffffffffffff88 = (item_event_visitor *)pvVar2->index;
      pvVar2 = std::
               vector<jsoncons::msgpack::parse_state,_std::allocator<jsoncons::msgpack::parse_state>_>
               ::back((vector<jsoncons::msgpack::parse_state,_std::allocator<jsoncons::msgpack::parse_state>_>
                       *)in_stack_ffffffffffffff80);
      if (in_stack_ffffffffffffff88 < (item_event_visitor *)pvVar2->length) {
        pvVar2 = std::
                 vector<jsoncons::msgpack::parse_state,_std::allocator<jsoncons::msgpack::parse_state>_>
                 ::back((vector<jsoncons::msgpack::parse_state,_std::allocator<jsoncons::msgpack::parse_state>_>
                         *)in_stack_ffffffffffffff80);
        pvVar2->index = pvVar2->index + 1;
        pvVar2 = std::
                 vector<jsoncons::msgpack::parse_state,_std::allocator<jsoncons::msgpack::parse_state>_>
                 ::back((vector<jsoncons::msgpack::parse_state,_std::allocator<jsoncons::msgpack::parse_state>_>
                         *)in_stack_ffffffffffffff80);
        pvVar2->mode = map_value;
        read_item(in_stack_00000240,in_stack_00000238,in_stack_00000230);
        bVar1 = std::error_code::operator_cast_to_bool(in_RDX);
        if (bVar1) {
          return;
        }
      }
      else {
        end_object(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
      }
      break;
    case map_value:
      pvVar2 = std::
               vector<jsoncons::msgpack::parse_state,_std::allocator<jsoncons::msgpack::parse_state>_>
               ::back((vector<jsoncons::msgpack::parse_state,_std::allocator<jsoncons::msgpack::parse_state>_>
                       *)in_stack_ffffffffffffff80);
      pvVar2->mode = map_key;
      read_item(in_stack_00000240,in_stack_00000238,in_stack_00000230);
      bVar1 = std::error_code::operator_cast_to_bool(in_RDX);
      if (bVar1) {
        return;
      }
    }
  }
  return;
}

Assistant:

void parse(item_event_visitor& visitor, std::error_code& ec)
    {
        while (!done_ && more_)
        {
            switch (state_stack_.back().mode)
            {
                case parse_mode::array:
                {
                    if (state_stack_.back().index < state_stack_.back().length)
                    {
                        ++state_stack_.back().index;
                        read_item(visitor, ec);
                        if (JSONCONS_UNLIKELY(ec))
                        {
                            return;
                        }
                    }
                    else
                    {
                        end_array(visitor, ec);
                    }
                    break;
                }
                case parse_mode::map_key:
                {
                    if (state_stack_.back().index < state_stack_.back().length)
                    {
                        ++state_stack_.back().index;
                        state_stack_.back().mode = parse_mode::map_value;
                        read_item(visitor, ec);
                        if (JSONCONS_UNLIKELY(ec))
                        {
                            return;
                        }
                    }
                    else
                    {
                        end_object(visitor, ec);
                    }
                    break;
                }
                case parse_mode::map_value:
                {
                    state_stack_.back().mode = parse_mode::map_key;
                    read_item(visitor, ec);
                    if (JSONCONS_UNLIKELY(ec))
                    {
                        return;
                    }
                    break;
                }
                case parse_mode::root:
                {
                    state_stack_.back().mode = parse_mode::accept;
                    read_item(visitor, ec);
                    if (JSONCONS_UNLIKELY(ec))
                    {
                        return;
                    }
                    break;
                }
                case parse_mode::accept:
                {
                    JSONCONS_ASSERT(state_stack_.size() == 1);
                    state_stack_.clear();
                    more_ = false;
                    done_ = true;
                    visitor.flush();
                    break;
                }
            }
        }
    }